

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_packet.cc
# Opt level: O0

void __thiscall QuickPacket::QuickPacket(QuickPacket *this)

{
  pointer __p;
  QuickPacket *this_local;
  
  this->_sequence_number = 0;
  this->_packet_number = 0;
  std::unique_ptr<unsigned_char,std::default_delete<unsigned_char>>::
  unique_ptr<std::default_delete<unsigned_char>,void>
            ((unique_ptr<unsigned_char,std::default_delete<unsigned_char>> *)&this->_data);
  this->_data_len = 0;
  this->_acked = false;
  __p = (pointer)operator_new__(0x578);
  std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::reset(&this->_data,__p);
  return;
}

Assistant:

QuickPacket::QuickPacket()
{
	_data.reset(new uint8_t[MAX_PKT_LEN]);
}